

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

iterator __thiscall
QMap<QByteArray,_QByteArray>::insert
          (QMap<QByteArray,_QByteArray> *this,const_iterator pos,QByteArray *key,QByteArray *value)

{
  long lVar1;
  bool bVar2;
  _Rb_tree_const_iterator<std::pair<const_QByteArray,_QByteArray>_> in_RSI;
  _Rb_tree_const_iterator<std::pair<const_QByteArray,_QByteArray>_> in_RDI;
  long in_FS_OFFSET;
  difference_type posDistance;
  QMap<QByteArray,_QByteArray> copy;
  const_iterator dpos;
  iterator in_stack_ffffffffffffff68;
  _Rb_tree_const_iterator<std::pair<const_QByteArray,_QByteArray>_> in_stack_ffffffffffffff70;
  _Rb_tree_const_iterator<std::pair<const_QByteArray,_QByteArray>_> in_stack_ffffffffffffff88;
  const_iterator in_stack_ffffffffffffff90;
  undefined8 local_28;
  iterator local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::_Rb_tree_const_iterator<std::pair<const_QByteArray,_QByteArray>_>::_Rb_tree_const_iterator
            ((_Rb_tree_const_iterator<std::pair<const_QByteArray,_QByteArray>_> *)
             &stack0xffffffffffffffe0);
  local_28 = 0xaaaaaaaaaaaaaaaa;
  bVar2 = QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_>
          ::isShared((QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_>
                      *)in_stack_ffffffffffffff70._M_node);
  if (bVar2) {
    QMap((QMap<QByteArray,_QByteArray> *)in_stack_ffffffffffffff70._M_node,
         (QMap<QByteArray,_QByteArray> *)in_stack_ffffffffffffff68._M_node);
  }
  else {
    memset(&local_28,0,8);
    QMap((QMap<QByteArray,_QByteArray> *)0x12499b);
  }
  bVar2 = QtPrivate::QExplicitlySharedDataPointerV2::operator_cast_to_bool
                    ((QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_>
                      *)0x1249a5);
  if ((!bVar2) ||
     (bVar2 = QtPrivate::
              QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_>
              ::isShared((QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_>
                          *)in_stack_ffffffffffffff70._M_node), bVar2)) {
    bVar2 = QtPrivate::QExplicitlySharedDataPointerV2::operator_cast_to_bool
                      ((QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_>
                        *)0x1249c8);
    if (bVar2) {
      QtPrivate::
      QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_>
      ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_>
                    *)0x1249d8);
      std::
      map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>
      ::cbegin((map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>
                *)in_stack_ffffffffffffff68._M_node);
      std::distance<std::_Rb_tree_const_iterator<std::pair<QByteArray_const,QByteArray>>>
                (in_stack_ffffffffffffff88,in_RDI);
    }
    detach((QMap<QByteArray,_QByteArray> *)in_stack_ffffffffffffff70._M_node);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_>
    ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_>
                  *)0x124a33);
    in_stack_ffffffffffffff90 =
         std::
         map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>
         ::cbegin(in_stack_ffffffffffffff68._M_node);
    in_RSI = std::next<std::_Rb_tree_const_iterator<std::pair<QByteArray_const,QByteArray>>>
                       (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68._M_node);
  }
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>_>_>
                *)0x124a7b);
  std::
  map<QByteArray,QByteArray,std::less<QByteArray>,std::allocator<std::pair<QByteArray_const,QByteArray>>>
  ::insert_or_assign<QByteArray_const&>
            ((map<QByteArray,_QByteArray,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QByteArray>_>_>
              *)in_stack_ffffffffffffff90._M_node,(const_iterator)in_RSI._M_node,
             (key_type *)in_stack_ffffffffffffff88._M_node,(QByteArray *)in_RDI._M_node);
  iterator::iterator((iterator *)0x124ab7,in_stack_ffffffffffffff68);
  ~QMap((QMap<QByteArray,_QByteArray> *)0x124ac1);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (iterator)(iterator)local_10._M_node;
}

Assistant:

iterator insert(const_iterator pos, const Key &key, const T &value)
    {
        // TODO: improve. In case of assignment, why copying first?
        typename Map::const_iterator dpos;
        const auto copy = d.isShared() ? *this : QMap(); // keep `key`/`value` alive across the detach
        if (!d || d.isShared()) {
            auto posDistance = d ? std::distance(d->m.cbegin(), pos.i) : 0;
            detach();
            dpos = std::next(d->m.cbegin(), posDistance);
        } else {
            dpos = pos.i;
        }
        return iterator(d->m.insert_or_assign(dpos, key, value));
    }